

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::~json_service(json_service *this)

{
  void *in_RDI;
  
  ~json_service((json_service *)0x120d08);
  operator_delete(in_RDI);
  return;
}

Assistant:

json_service(cppcms::service &srv) : cppcms::rpc::json_rpc_server(srv)
	{
		bind("sum",cppcms::rpc::json_method(&json_service::sum,this),method_role);
		bind("div",cppcms::rpc::json_method(&json_service::div,this),method_role);
		bind("notify",cppcms::rpc::json_method(&json_service::div,this),notification_role);
		bind("both",cppcms::rpc::json_method(&json_service::both,this));

		std::cout << "Checking bindings" << std::endl;
		check_method(cppcms::rpc::json_method(&json_service::compiles1c,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2c,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3c,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4c,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5c,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6c,this),"[[1]]");
		
		check_method(cppcms::rpc::json_method(&json_service::compiles1cr,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2cr,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3cr,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4cr,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5cr,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6cr,this),"[[1]]");

		check_method(cppcms::rpc::json_method(&json_service::compiles1v,this),"[10]");
		check_method(cppcms::rpc::json_method(&json_service::compiles2v,this),"[\"str\"]");
		check_method(cppcms::rpc::json_method(&json_service::compiles3v,this),"[[1,2]]");
		check_method(cppcms::rpc::json_method(&json_service::compiles4v,this),"[{}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles5v,this),"[{\"member\":1}]");
		check_method(cppcms::rpc::json_method(&json_service::compiles6v,this),"[[1]]");

		std::cout << "Ok" << std::endl;

		smd_raw("{}");
	}